

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::sessionFixtureNext_IOExceptionHandledAndNotLoggedOnHelper::
~sessionFixtureNext_IOExceptionHandledAndNotLoggedOnHelper
          (sessionFixtureNext_IOExceptionHandledAndNotLoggedOnHelper *this)

{
  sessionFixture::~sessionFixture(&this->super_sessionFixture);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, Next_IOExceptionHandledAndNotLoggedOn) {

  Session* sessionObject;

  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionIDCustom( BeginString( "FIX.4.2" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
  TimeRange sessionTimeCustom( startTime, endTime, 0, 31);

  DataDictionaryProvider providerCustom;
  providerCustom.addTransportDataDictionary( sessionIDCustom.getBeginString(), "../spec/FIX42.xml" );
  Dictionary dict;
  dict.setString("ConnectionType", "initiator");

  SessionSettings settings;
  settings.set(sessionIDCustom, dict);

  ExceptionMessageStoreFactory exceptionFactory(settings);
  sessionObject = new Session( *this, exceptionFactory, sessionIDCustom, providerCustom,
      sessionTimeCustom, 1, 0);

  UtcTimeStamp oldTime(8, 8, 8, 13, 5, 2010);
  sessionObject->next(oldTime);

  CHECK(!sessionObject->isLoggedOn());

  delete sessionObject;
}